

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void set_twopass_params_based_on_fp_stats(AV1_COMP *cpi,FIRSTPASS_STATS *this_frame_ptr)

{
  double *pdVar1;
  double dVar2;
  
  if (this_frame_ptr != (FIRSTPASS_STATS *)0x0) {
    dVar2 = log1p(this_frame_ptr->intra_error);
    (cpi->twopass_frame).mb_av_energy = dVar2;
    pdVar1 = &((cpi->ppi->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy;
    if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
      dVar2 = log1p(this_frame_ptr->frame_avg_wavelet_energy);
      (cpi->twopass_frame).frame_avg_haar_energy = dVar2;
    }
    (cpi->twopass_frame).fr_content_type = 0.15 <= this_frame_ptr->intra_skip_pct;
  }
  return;
}

Assistant:

static inline void set_twopass_params_based_on_fp_stats(
    AV1_COMP *cpi, const FIRSTPASS_STATS *this_frame_ptr) {
  if (this_frame_ptr == NULL) return;

  TWO_PASS_FRAME *twopass_frame = &cpi->twopass_frame;
  // The multiplication by 256 reverses a scaling factor of (>> 8)
  // applied when combining MB error values for the frame.
  twopass_frame->mb_av_energy = log1p(this_frame_ptr->intra_error);

  const FIRSTPASS_STATS *const total_stats =
      cpi->ppi->twopass.stats_buf_ctx->total_stats;
  if (is_fp_wavelet_energy_invalid(total_stats) == 0) {
    twopass_frame->frame_avg_haar_energy =
        log1p(this_frame_ptr->frame_avg_wavelet_energy);
  }

  // Set the frame content type flag.
  if (this_frame_ptr->intra_skip_pct >= FC_ANIMATION_THRESH)
    twopass_frame->fr_content_type = FC_GRAPHICS_ANIMATION;
  else
    twopass_frame->fr_content_type = FC_NORMAL;
}